

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::UpperTriangularLayerParams::~UpperTriangularLayerParams
          (UpperTriangularLayerParams *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 == (undefined8 *)0x0) {
    SharedDtor(this);
    google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_);
  }
  google::protobuf::MessageLite::~MessageLite(&this->super_MessageLite);
  return;
}

Assistant:

UpperTriangularLayerParams::~UpperTriangularLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.UpperTriangularLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}